

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_types.cpp
# Opt level: O3

void duckdb::TestAllTypesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  idx_t iVar1;
  GlobalTableFunctionState *pGVar2;
  reference this;
  reference val;
  _func_int **__n;
  size_type __n_00;
  ulong index;
  bool bVar3;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar2 = (data_p->global_state).ptr;
  __n = pGVar2[4]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)
            (((long)pGVar2[2]._vptr_GlobalTableFunctionState -
              (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 3) * -0x5555555555555555)) {
    index = 0;
    do {
      pGVar2[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      this = vector<duckdb::vector<duckdb::Value,_true>,_true>::operator[]
                       ((vector<duckdb::vector<duckdb::Value,_true>,_true> *)(pGVar2 + 1),
                        (size_type)__n);
      if ((this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __n_00 = 0;
        do {
          val = vector<duckdb::Value,_true>::operator[](this,__n_00);
          DataChunk::SetValue(output,__n_00,index,val);
          __n_00 = __n_00 + 1;
        } while (__n_00 < (ulong)((long)(this->
                                        super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                                        .
                                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->
                                        super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                                        .
                                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 6));
      }
      iVar1 = index + 1;
      __n = pGVar2[4]._vptr_GlobalTableFunctionState;
    } while ((__n < (_func_int **)
                    (((long)pGVar2[2]._vptr_GlobalTableFunctionState -
                      (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 3) * -0x5555555555555555))
            && (bVar3 = index < 0x7ff, index = iVar1, bVar3));
    output->count = iVar1;
  }
  return;
}

Assistant:

void TestAllTypesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<TestAllTypesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &vals = data.entries[data.offset++];
		for (idx_t col_idx = 0; col_idx < vals.size(); col_idx++) {
			output.SetValue(col_idx, count, vals[col_idx]);
		}
		count++;
	}
	output.SetCardinality(count);
}